

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_projection2.c
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ALLEGRO_BITMAP *pAVar12;
  undefined8 uVar13;
  long lVar14;
  long in_RSI;
  int in_EDI;
  double dVar15;
  undefined8 uVar16;
  float unaff_retaddr;
  float unaff_retaddr_00;
  float in_stack_00000008;
  float in_stack_0000000c;
  ALLEGRO_BITMAP *in_stack_00000010;
  ALLEGRO_EVENT event;
  float theta;
  int display_flags;
  _Bool background;
  _Bool fullscreen;
  _Bool quit;
  _Bool redraw;
  ALLEGRO_FONT *font;
  ALLEGRO_BITMAP *buffer;
  ALLEGRO_BITMAP *display_sub_ortho;
  ALLEGRO_BITMAP *display_sub_persp;
  ALLEGRO_BITMAP *texture;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_TIMER *timer;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_BITMAP *in_stack_ffffffffffffff10;
  ALLEGRO_BITMAP *bmp;
  int local_a8 [8];
  int local_88;
  float local_5c;
  undefined4 local_58;
  byte local_53;
  
  bVar3 = false;
  bVar1 = 0;
  local_53 = 0;
  bVar2 = false;
  local_58 = 0x10;
  local_5c = 0.0;
  if (1 < in_EDI) {
    iVar4 = strcmp(*(char **)(in_RSI + 8),"--use-shaders");
    if (iVar4 == 0) {
      local_58 = 0x810;
    }
    else {
      abort_example("Unknown command line argument: %s\n",*(undefined8 *)(in_RSI + 8));
    }
  }
  uVar5 = al_install_system(0x5020700,atexit);
  if ((uVar5 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_init_image_addon();
  al_init_primitives_addon();
  al_init_font_addon();
  init_platform_specific();
  al_install_keyboard();
  al_set_new_display_flags(local_58);
  al_set_new_display_option(0xf,0x10,2);
  al_set_new_display_option(0x1c,0,1);
  lVar6 = al_create_display(800,600);
  if (lVar6 == 0) {
    abort_example("Error creating display\n");
  }
  al_set_window_constraints(lVar6,0x100,0x200,0);
  al_apply_window_constraints(lVar6,1);
  al_get_backbuffer(lVar6);
  set_perspective_transform(in_stack_ffffffffffffff10);
  uVar7 = al_get_backbuffer(lVar6);
  uVar7 = al_create_sub_bitmap(uVar7,0,0,0x100);
  set_perspective_transform(in_stack_ffffffffffffff10);
  uVar8 = al_get_backbuffer(lVar6);
  uVar8 = al_create_sub_bitmap(uVar8,0,0,0x100,0x200);
  uVar9 = al_create_bitmap(200);
  set_perspective_transform(in_stack_ffffffffffffff10);
  uVar10 = al_create_timer(0x3f91111111111111);
  uVar11 = al_create_builtin_font();
  pAVar12 = (ALLEGRO_BITMAP *)al_create_event_queue();
  uVar13 = al_get_keyboard_event_source();
  al_register_event_source(pAVar12,uVar13);
  uVar13 = al_get_display_event_source(lVar6);
  al_register_event_source(pAVar12,uVar13);
  bmp = pAVar12;
  uVar13 = al_get_timer_event_source(uVar10);
  al_register_event_source(bmp,uVar13);
  al_set_new_bitmap_flags(0x1c0);
  lVar14 = al_load_bitmap("data/bkg.png");
  if (lVar14 == 0) {
    abort_example("Could not load data/bkg.png");
  }
  al_start_timer(uVar10);
  while ((bool)(bVar1 ^ 1)) {
    al_wait_for_event(pAVar12,local_a8);
    if (local_a8[0] - 10U < 0x27 || local_a8[0] == 0x31) {
      switch((long)&switchD_00102999::switchdataD_00104050 +
             (long)(int)(&switchD_00102999::switchdataD_00104050)[local_a8[0] - 10U]) {
      case 0x10299b:
        bVar1 = 1;
        break;
      case 0x1029a8:
        al_acknowledge_resize(lVar6);
        al_get_backbuffer(lVar6);
        set_perspective_transform(bmp);
        break;
      case 0x1029cf:
        if (local_88 == 0x3b) {
          bVar1 = 1;
        }
        else if (local_88 == 0x4b) {
          local_53 = (local_53 ^ 0xff) & 1;
          al_set_display_flag(lVar6,0x200,local_53);
          al_get_backbuffer(lVar6);
          set_perspective_transform(bmp);
        }
        break;
      case 0x102a40:
        bVar3 = true;
        dVar15 = fmod((double)local_5c + 0.05,6.283185307179586);
        local_5c = (float)dVar15;
        break;
      case 0x102a7d:
        bVar2 = true;
        al_acknowledge_drawing_halt(lVar6);
        al_stop_timer(uVar10);
        break;
      case 0x102aa1:
        bVar2 = false;
        al_acknowledge_drawing_resume(lVar6);
        al_start_timer(uVar10);
      }
    }
    if (((!bVar2) && (bVar3)) && (uVar5 = al_is_event_queue_empty(pAVar12), (uVar5 & 1) != 0)) {
      al_set_target_backbuffer(lVar6);
      al_set_render_state();
      uVar16 = 0;
      uVar13 = al_map_rgb_f(0);
      al_clear_to_color(uVar13,uVar16);
      al_clear_depth_buffer();
      draw_pyramid(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                   unaff_retaddr);
      al_set_target_bitmap(uVar9);
      al_set_render_state(0x12,1);
      uVar16 = 0x3dcccccd;
      uVar13 = al_map_rgb_f(0);
      al_clear_to_color(uVar13,uVar16);
      al_clear_depth_buffer(0x447a0000);
      draw_pyramid(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                   unaff_retaddr);
      al_set_target_bitmap(uVar7);
      al_set_render_state(0x12,1);
      uVar16 = 0;
      uVar13 = al_map_rgb_f(0,0,0x3e800000);
      al_clear_to_color(uVar13,uVar16);
      al_clear_depth_buffer(0x447a0000);
      draw_pyramid(in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,
                   unaff_retaddr);
      al_set_target_bitmap(uVar8);
      al_set_render_state(0x12,0);
      uVar16 = 0x3f800000;
      uVar13 = al_map_rgb_f(0x3f800000);
      al_draw_text(uVar13,uVar16,0x43000000,0x41800000,uVar11,1,"Press Space to toggle fullscreen");
      al_draw_bitmap(0,0x43800000,uVar9,0);
      al_flip_display();
      bVar3 = false;
    }
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_BITMAP *texture;
   ALLEGRO_BITMAP *display_sub_persp;
   ALLEGRO_BITMAP *display_sub_ortho;
   ALLEGRO_BITMAP *buffer;
   ALLEGRO_FONT *font;
   bool redraw = false;
   bool quit = false;
   bool fullscreen = false;
   bool background = false;
   int display_flags = ALLEGRO_RESIZABLE;
   float theta = 0;

   if (argc > 1) {
      if(strcmp(argv[1], "--use-shaders") == 0) {
         display_flags |= ALLEGRO_PROGRAMMABLE_PIPELINE;
      }
      else {
         abort_example("Unknown command line argument: %s\n", argv[1]);
      }
   }

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_init_image_addon();
   al_init_primitives_addon();
   al_init_font_addon();
   init_platform_specific();
   al_install_keyboard();

   al_set_new_display_flags(display_flags);
   al_set_new_display_option(ALLEGRO_DEPTH_SIZE, 16, ALLEGRO_SUGGEST);
   /* Load everything as a POT bitmap to make sure the projection stuff works
    * with mismatched backing texture and bitmap sizes. */
   al_set_new_display_option(ALLEGRO_SUPPORT_NPOT_BITMAP, 0, ALLEGRO_REQUIRE);
   display = al_create_display(800, 600);
   if (!display) {
      abort_example("Error creating display\n");
   }
   al_set_window_constraints(display, 256, 512, 0, 0);
   al_apply_window_constraints(display, true);
   set_perspective_transform(al_get_backbuffer(display));

   /* This bitmap is a sub-bitmap of the display, and has a perspective transformation. */
   display_sub_persp = al_create_sub_bitmap(al_get_backbuffer(display), 0, 0, 256, 256);
   set_perspective_transform(display_sub_persp);

   /* This bitmap is a sub-bitmap of the display, and has a orthographic transformation. */
   display_sub_ortho = al_create_sub_bitmap(al_get_backbuffer(display), 0, 0, 256, 512);

   /* This bitmap has a perspective transformation, purposefully non-POT */
   buffer = al_create_bitmap(200, 200);
   set_perspective_transform(buffer);

   timer = al_create_timer(1.0 / 60);
   font = al_create_builtin_font();

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));

   al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR |
      ALLEGRO_MIPMAP);

   texture = al_load_bitmap("data/bkg.png");
   if (!texture) {
      abort_example("Could not load data/bkg.png");
   }

   al_start_timer(timer);
   while (!quit) {
      ALLEGRO_EVENT event;

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            quit = true;
            break;
         case ALLEGRO_EVENT_DISPLAY_RESIZE:
            al_acknowledge_resize(display);
            set_perspective_transform(al_get_backbuffer(display));
            break;
         case ALLEGRO_EVENT_KEY_DOWN:
            switch (event.keyboard.keycode) {
               case ALLEGRO_KEY_ESCAPE:
                  quit = true;
                  break;
               case ALLEGRO_KEY_SPACE:
                  fullscreen = !fullscreen;
                  al_set_display_flag(display, ALLEGRO_FULLSCREEN_WINDOW, fullscreen);
                  set_perspective_transform(al_get_backbuffer(display));
                  break;
            }
            break;
         case ALLEGRO_EVENT_TIMER:
            redraw = true;
            theta = fmod(theta + 0.05, 2 * ALLEGRO_PI);
            break;
         case ALLEGRO_EVENT_DISPLAY_HALT_DRAWING:
            background = true;
            al_acknowledge_drawing_halt(display);
            al_stop_timer(timer);
            break;
         case ALLEGRO_EVENT_DISPLAY_RESUME_DRAWING:
            background = false;
            al_acknowledge_drawing_resume(display);
            al_start_timer(timer);
            break;
      }

      if (!background && redraw && al_is_event_queue_empty(queue)) {
         al_set_target_backbuffer(display);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 1);
         al_clear_to_color(al_map_rgb_f(0, 0, 0));
         al_clear_depth_buffer(1000);
         draw_pyramid(texture, 0, 0, -4, theta);

         al_set_target_bitmap(buffer);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 1);
         al_clear_to_color(al_map_rgb_f(0, 0.1, 0.1));
         al_clear_depth_buffer(1000);
         draw_pyramid(texture, 0, 0, -4, theta);

         al_set_target_bitmap(display_sub_persp);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 1);
         al_clear_to_color(al_map_rgb_f(0, 0, 0.25));
         al_clear_depth_buffer(1000);
         draw_pyramid(texture, 0, 0, -4, theta);

         al_set_target_bitmap(display_sub_ortho);
         al_set_render_state(ALLEGRO_DEPTH_TEST, 0);
         al_draw_text(font, al_map_rgb_f(1, 1, 1), 128, 16, ALLEGRO_ALIGN_CENTER,
                      "Press Space to toggle fullscreen");
         al_draw_bitmap(buffer, 0, 256, 0);

         al_flip_display();
         redraw = false;
      }
   }
   return 0;
}